

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::DescriptorScriptPubKeyMan::ReturnDestination
          (DescriptorScriptPubKeyMan *this,int64_t index,bool internal,CTxDestination *addr)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  long in_FS_OFFSET;
  WalletBatch local_58;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  uint256 local_38;
  long local_18;
  WalletDatabase *pWVar3;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock58,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x861,false);
  lVar2 = (long)(this->m_wallet_descriptor).next_index + -1;
  if (lVar2 == index) {
    (this->m_wallet_descriptor).next_index = (int32_t)lVar2;
  }
  iVar1 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar1);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_58,pWVar3,1);
  local_58.m_database = pWVar3;
  (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_38,this);
  WalletBatch::WriteDescriptor(&local_58,&local_38,&this->m_wallet_descriptor);
  if (local_58.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (*(*(_func_int ***)
        local_58.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_ScriptPubKeyMan).NotifyCanGetAddressesChanged);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock58.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::ReturnDestination(int64_t index, bool internal, const CTxDestination& addr)
{
    LOCK(cs_desc_man);
    // Only return when the index was the most recent
    if (m_wallet_descriptor.next_index - 1 == index) {
        m_wallet_descriptor.next_index--;
    }
    WalletBatch(m_storage.GetDatabase()).WriteDescriptor(GetID(), m_wallet_descriptor);
    NotifyCanGetAddressesChanged();
}